

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_dtoa(JSContext *ctx,double d,int radix,int n_digits,int flags)

{
  JSValue JVar1;
  char buf [128];
  char *in_stack_ffffffffffffff48;
  JSContext *in_stack_ffffffffffffff50;
  
  js_dtoa1((char *)buf._64_8_,(double)buf._56_8_,buf._52_4_,buf._48_4_,buf._44_4_);
  JVar1 = JS_NewString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return JVar1;
}

Assistant:

static JSValue js_dtoa(JSContext *ctx,
                       double d, int radix, int n_digits, int flags)
{
    char buf[JS_DTOA_BUF_SIZE];
    js_dtoa1(buf, d, radix, n_digits, flags);
    return JS_NewString(ctx, buf);
}